

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O3

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_isRefinementOver(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,bool *primalFeasible,bool *dualFeasible,Rational *boundsViolation,
                   Rational *sideViolation,Rational *redCostViolation,Rational *dualViolation,
                   int minIRRoundsRemaining,bool *stoppedTime,bool *stoppedIter,
                   int numFailedRefinements)

{
  Verbosity VVar1;
  bool bVar2;
  int iVar3;
  Verbosity old_verbosity;
  
  iVar3 = boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::compare(&boundsViolation->m_backend,&(this->_rationalFeastol).m_backend);
  if (iVar3 < 1) {
    iVar3 = boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::compare(&sideViolation->m_backend,&(this->_rationalFeastol).m_backend);
    bVar2 = iVar3 < 1;
  }
  else {
    bVar2 = false;
  }
  *primalFeasible = bVar2;
  iVar3 = boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::compare(&redCostViolation->m_backend,&(this->_rationalOpttol).m_backend);
  if (iVar3 < 1) {
    iVar3 = boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::compare(&dualViolation->m_backend,&(this->_rationalOpttol).m_backend);
    *dualFeasible = iVar3 < 1;
    if ((iVar3 < 1) && (*primalFeasible != false)) {
      VVar1 = (this->spxout).m_verbosity;
      if (minIRRoundsRemaining < 0) {
        if ((int)VVar1 < 3) {
          return true;
        }
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],"Tolerances reached.\n",0x14);
        (this->spxout).m_verbosity = VVar1;
        return true;
      }
      if (2 < (int)VVar1) {
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],
                   "Tolerances reached but minIRRoundsRemaining forcing additional refinement rounds.\n"
                   ,0x52);
        (this->spxout).m_verbosity = VVar1;
      }
    }
  }
  else {
    *dualFeasible = false;
  }
  bVar2 = _isSolveStopped(this,stoppedTime,stoppedIter);
  return 2 < numFailedRefinements || bVar2;
}

Assistant:

bool SoPlexBase<R>::_isRefinementOver(
   bool& primalFeasible,
   bool& dualFeasible,
   Rational& boundsViolation,
   Rational& sideViolation,
   Rational& redCostViolation,
   Rational& dualViolation,
   int minIRRoundsRemaining,
   bool& stoppedTime,
   bool& stoppedIter,
   int numFailedRefinements)
{
   // terminate if tolerances are satisfied
   primalFeasible = (boundsViolation <= _rationalFeastol && sideViolation <= _rationalFeastol);
   dualFeasible = (redCostViolation <= _rationalOpttol && dualViolation <= _rationalOpttol);

   if(primalFeasible && dualFeasible)
   {
      if(minIRRoundsRemaining < 0)
      {
         SPX_MSG_INFO1(spxout, spxout << "Tolerances reached.\n");
         return true;
      }
      else
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "Tolerances reached but minIRRoundsRemaining forcing additional refinement rounds.\n");
      }
   }

   // terminate if some limit is reached
   if(_isSolveStopped(stoppedTime, stoppedIter) || numFailedRefinements > 2)
      return true;

   return false;
}